

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  bool bVar1;
  string_view value;
  string_view value_00;
  string arch;
  string tgt;
  cmValue platform;
  cmAlphaNum local_c0;
  char *local_90;
  size_t local_88;
  string local_70;
  cmValue local_50;
  cmAlphaNum local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"GHS_PRIMARY_TARGET",(allocator<char> *)&local_48);
  cmMakefile::GetDefinition(mf,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = cmIsOff((cmValue)0x2453e1);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"arm",(allocator<char> *)&local_c0);
    value_00._M_str = (p->_M_dataplus)._M_p;
    value_00._M_len = p->_M_string_length;
    bVar1 = cmValue::IsOff(value_00);
    if (!bVar1) {
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"GHS_TARGET_PLATFORM",(allocator<char> *)&local_48);
    local_50 = cmMakefile::GetDefinition(mf,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    local_c0.View_._M_len = local_88;
    local_c0.View_._M_str = local_90;
    local_48.View_._M_str = local_48.Digits_;
    local_48.View_._M_len = 1;
    local_48.Digits_[0] = '_';
    cmStrCat<cmValue,char[5]>(&local_70,&local_c0,&local_48,&local_50,(char (*) [5])".tgt");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"GHS_PRIMARY_TARGET",(allocator<char> *)&local_48);
    value._M_str = local_70._M_dataplus._M_p;
    value._M_len = local_70._M_string_length;
    cmMakefile::AddDefinition(mf,(string *)&local_c0,value);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  /* set primary target */
  cmValue t = mf->GetDefinition("GHS_PRIMARY_TARGET");
  if (cmIsOff(t)) {
    /* Use the value from `-A` or use `arm` */
    std::string arch = "arm";
    if (!cmIsOff(p)) {
      arch = p;
    }
    cmValue platform = mf->GetDefinition("GHS_TARGET_PLATFORM");
    std::string tgt = cmStrCat(arch, '_', platform, ".tgt");

    /* update the primary target name*/
    mf->AddDefinition("GHS_PRIMARY_TARGET", tgt);
  }
  return true;
}